

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.cpp
# Opt level: O1

void __thiscall mau::ProxySession::workerLoop(ProxySession *this)

{
  error_category *peVar1;
  error_code __ec;
  error_code local_50;
  system_error local_40 [32];
  
  SetCurrentThreadName("ProxySession:Worker");
  if (((this->Terminated)._M_base._M_i & 1U) == 0) {
    peVar1 = (error_category *)std::_V2::system_category();
    do {
      local_50._M_value = 0;
      local_50._M_cat = peVar1;
      asio::detail::scheduler::run
                (((this->super_DeliveryCommonData).Context.
                  super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->impl_,
                 &local_50);
      __ec._4_4_ = 0;
      __ec._M_value = local_50._M_value;
      if (local_50._M_value != 0) {
        __ec._M_cat = local_50._M_cat;
        std::system_error::system_error(local_40,__ec);
        asio::detail::throw_exception<std::system_error>(local_40);
        std::system_error::~system_error(local_40);
      }
    } while (((this->Terminated)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void ProxySession::workerLoop()
{
    SetCurrentThreadName("ProxySession:Worker");

    while (!Terminated) {
        Context->run();
    }
}